

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O2

int __thiscall chrono::collision::CHOBBTree::ResetModel(CHOBBTree *this)

{
  ChCollisionTree::ResetModel(&this->super_ChCollisionTree);
  std::vector<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>::clear(&this->b);
  this->current_box = 0;
  return 0;
}

Assistant:

int CHOBBTree::ResetModel() {
    // INHERIT PARENT CLASS RESET FUNCTION
    ChCollisionTree::ResetModel();

    b.clear();

    current_box = 0;

    return ChC_OK;
}